

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O1

bool __thiscall
gl4cts::UncommittedRegionsAccessTestCase::verifyAtomicOperations
          (UncommittedRegionsAccessTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  undefined1 *this_00;
  pointer *__x;
  GLint GVar1;
  UncommittedRegionsAccessTestCase *pUVar2;
  _Alloc_hider _Var3;
  pointer __s;
  pointer puVar4;
  GLenum GVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  size_t sVar9;
  TestError *this_01;
  undefined4 in_register_0000000c;
  int iVar10;
  long lVar11;
  Functions *pFVar12;
  int iVar13;
  SparseTexture2CommitmentTestCase *this_02;
  char *pcVar14;
  bool bVar15;
  size_type __new_size;
  GLint depth;
  GLint height;
  GLint width;
  GLenum local_410;
  int local_40c;
  GLuint verifyTexture;
  int local_404;
  Functions *local_400;
  undefined8 local_3f8;
  int local_3f0;
  GLint local_3ec;
  ostream *local_3e8;
  UncommittedRegionsAccessTestCase *local_3e0;
  string shader;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  string dataType;
  string local_378;
  string local_358;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  ShaderProgram program;
  ProgramSources local_240;
  TokenStrings s;
  
  local_3f8 = CONCAT44(in_register_0000000c,format);
  this_00 = &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
             field_0x88;
  local_400 = gl;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Verify Atomic Operations [level: ",0x21);
  local_3e8 = (ostream *)this_00;
  poVar8 = (ostream *)std::ostream::operator<<(this_00,level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] - ",4);
  if ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
      levels + -1 < level) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
               ,0x75e);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_404 = target;
  SparseTextureUtils::getTextureLevelSize
            (target,&(this->super_SparseTexture2CommitmentTestCase).
                     super_SparseTextureCommitmentTestCase.mState,level,&width,&height,&depth);
  GVar1 = width;
  bVar15 = true;
  if ((height != 0 && 2 < width + 1U) &&
     ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
      minDepth <= depth)) {
    local_410 = 0x8c1a;
    if (local_404 == 0x9100) {
      local_410 = 0xde1;
    }
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __new_size = (size_type)(height * width * depth);
    local_3ec = level;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData,__new_size);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecOutData,__new_size);
    puVar4 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    __s = vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
    memset(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,0,__new_size);
    pFVar12 = local_400;
    gl4cts::Texture::Generate(local_400,&verifyTexture);
    gl4cts::Texture::Bind(pFVar12,verifyTexture,local_410);
    gl4cts::Texture::Storage(pFVar12,local_410,1,0x8229,width,height,depth);
    GVar5 = (*pFVar12->getError)();
    glu::checkError(GVar5,"Texture::Storage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                    ,0x784);
    pFVar12 = local_400;
    if ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
        samples < 1) {
      bVar15 = true;
    }
    else {
      local_3f0 = GVar1 / 2;
      bVar15 = true;
      local_40c = 0;
      local_3e0 = this;
      do {
        memset(__s,0xff,__new_size);
        gl4cts::Texture::Bind(pFVar12,verifyTexture,local_410);
        gl4cts::Texture::SubImage(pFVar12,local_410,0,0,0,0,width,height,depth,0x1903,0x1401,__s);
        GVar5 = (*pFVar12->getError)();
        glu::checkError(GVar5,"Texture::SubImage",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x78d);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&shader,st2_compute_atomicVerify,(allocator<char> *)&s);
        local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"image","");
        local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
        this_02 = (SparseTexture2CommitmentTestCase *)0x1be54c4;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"image","");
        SparseTexture2CommitmentTestCase::createShaderTokens
                  (&s,this_02,local_404,(GLint)local_3f8,local_40c,&local_378,&local_358);
        pUVar2 = local_3e0;
        pFVar12 = local_400;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        iVar6 = std::__cxx11::string::compare((char *)&s.returnType);
        pcVar14 = "uint";
        if (iVar6 == 0) {
          pcVar14 = "int";
        }
        dataType._M_dataplus._M_p = (pointer)&dataType.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&dataType,pcVar14,pcVar14 + (4 - (ulong)(iVar6 == 0)));
        replaceToken("<OUTPUT_TYPE>",s.outputType._M_dataplus._M_p,&shader);
        replaceToken("<FORMAT>",s.format._M_dataplus._M_p,&shader);
        replaceToken("<INPUT_TYPE>",s.inputType._M_dataplus._M_p,&shader);
        replaceToken("<POINT_TYPE>",s.pointType._M_dataplus._M_p,&shader);
        replaceToken("<POINT_DEF>",s.pointDef._M_dataplus._M_p,&shader);
        replaceToken("<DATA_TYPE>",dataType._M_dataplus._M_p,&shader);
        replaceToken("<SAMPLE_DEF>",s.sampleDef._M_dataplus._M_p,&shader);
        replaceToken("<RETURN_TYPE>",s.returnType._M_dataplus._M_p,&shader);
        local_240.transformFeedbackVaryings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        local_240._193_8_ = 0;
        local_240.transformFeedbackVaryings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_240.transformFeedbackVaryings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        local_240.transformFeedbackVaryings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        memset(&local_240,0,0xac);
        program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = 5;
        program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)(program.m_shaders + 1);
        __x = &program.m_shaders[0].
               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__x,shader._M_dataplus._M_p,
                   shader._M_dataplus._M_p + shader._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_240.sources +
                    (uint)program.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_start,(value_type *)__x);
        if ((vector<glu::Shader_*,_std::allocator<glu::Shader_*>_> *)
            program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != program.m_shaders + 1) {
          operator_delete(program.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_finish,
                          (long)program.m_shaders[1].
                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                _M_impl.super__Vector_impl_data._M_start + 1);
        }
        glu::ShaderProgram::ShaderProgram
                  (&program,((pUVar2->super_SparseTexture2CommitmentTestCase).
                             super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->
                            m_renderCtx,&local_240);
        if (program.m_program.m_info.linkOk == true) {
          (*pFVar12->useProgram)(program.m_program.m_program);
          GVar5 = (*pFVar12->getError)();
          glu::checkError(GVar5,"glUseProgram",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7a6);
          (*pFVar12->bindImageTexture)(0,verifyTexture,0,'\0',0,0x88b9,0x8232);
          GVar5 = (*pFVar12->getError)();
          glu::checkError(GVar5,"glBindImageTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7ad);
          (*pFVar12->bindImageTexture)(1,*texture,local_3ec,'\0',0,35000,(GLenum)local_3f8);
          GVar5 = (*pFVar12->getError)();
          glu::checkError(GVar5,"glBindImageTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7b4);
          (*pFVar12->uniform1i)(1,0);
          GVar5 = (*pFVar12->getError)();
          glu::checkError(GVar5,"glUniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7b6);
          (*pFVar12->uniform1i)(2,1);
          GVar5 = (*pFVar12->getError)();
          glu::checkError(GVar5,"glUniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7b8);
          (*pFVar12->uniform1i)(3,local_3f0);
          GVar5 = (*pFVar12->getError)();
          glu::checkError(GVar5,"glUniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7ba);
          (*pFVar12->dispatchCompute)(width,height,depth);
          GVar5 = (*pFVar12->getError)();
          glu::checkError(GVar5,"glDispatchCompute",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7bc);
          (*pFVar12->memoryBarrier)(0xffffffff);
          GVar5 = (*pFVar12->getError)();
          glu::checkError(GVar5,"glMemoryBarrier",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7be);
          gl4cts::Texture::GetData(pFVar12,0,local_410,0x1903,0x1401,__s);
          GVar5 = (*pFVar12->getError)();
          glu::checkError(GVar5,"Texture::GetData",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7c1);
          if (0 < width) {
            iVar6 = 0;
            do {
              if (0 < height) {
                iVar10 = 0;
                do {
                  if (0 < depth) {
                    iVar13 = 0;
                    do {
                      iVar7 = (height * iVar13 + iVar10) * width + iVar6;
                      if (puVar4[iVar7] != __s[iVar7]) {
                        bVar15 = false;
                        printf("%d:%d ");
                      }
                      iVar13 = iVar13 + 1;
                    } while (iVar13 < depth);
                  }
                  iVar10 = iVar10 + 1;
                } while (iVar10 < height);
              }
              iVar6 = iVar6 + 1;
            } while (iVar6 < width);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_3e8,"Compute shader compilation failed (atomic) for target: ",0x37);
          poVar8 = (ostream *)std::ostream::operator<<(local_3e8,local_404);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", format: ",10);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)local_3f8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", sample: ",10);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_40c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", infoLog: ",0xb);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,((*program.m_shaders[5].
                                        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                                     _M_dataplus._M_p,
                              ((*program.m_shaders[5].
                                 super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                              _M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", shaderSource: ",0x10);
          _Var3 = shader._M_dataplus;
          if (shader._M_dataplus._M_p == (pointer)0x0) {
            std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
          }
          else {
            sVar9 = strlen(shader._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,_Var3._M_p,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," - ",3);
          bVar15 = false;
        }
        glu::ShaderProgram::~ShaderProgram(&program);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_240.transformFeedbackVaryings);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(&local_240.attribLocationBindings);
        lVar11 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&local_240.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar11));
          pUVar2 = local_3e0;
          lVar11 = lVar11 + -0x18;
        } while (lVar11 != -0x18);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dataType._M_dataplus._M_p != &dataType.field_2) {
          operator_delete(dataType._M_dataplus._M_p,dataType.field_2._M_allocated_capacity + 1);
        }
        SparseTexture2CommitmentTestCase::TokenStrings::~TokenStrings(&s);
        pFVar12 = local_400;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shader._M_dataplus._M_p != &shader.field_2) {
          operator_delete(shader._M_dataplus._M_p,shader.field_2._M_allocated_capacity + 1);
        }
        local_40c = local_40c + 1;
      } while (local_40c <
               (pUVar2->super_SparseTexture2CommitmentTestCase).
               super_SparseTextureCommitmentTestCase.mState.samples);
    }
    gl4cts::Texture::Delete(pFVar12,&verifyTexture);
    if (vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)vecOutData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vecOutData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)vecExpData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vecExpData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar15;
}

Assistant:

bool UncommittedRegionsAccessTestCase::verifyAtomicOperations(const Functions& gl, GLint target, GLint format,
															  GLuint& texture, GLint level)
{
	mLog << "Verify Atomic Operations [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	// Create verifying texture
	GLint verifyTarget;
	if (target == GL_TEXTURE_2D_MULTISAMPLE)
		verifyTarget = GL_TEXTURE_2D;
	else
		verifyTarget = GL_TEXTURE_2D_ARRAY;

	GLint texSize = width * height * depth;

	std::vector<GLubyte> vecExpData;
	std::vector<GLubyte> vecOutData;
	vecExpData.resize(texSize);
	vecOutData.resize(texSize);
	GLubyte* exp_data = vecExpData.data();
	GLubyte* out_data = vecOutData.data();

	// Expected value in this case is 0 because atomic operations result on uncommitted regions are zeros
	deMemset(exp_data, 0, texSize);

	GLuint verifyTexture;
	Texture::Generate(gl, verifyTexture);
	Texture::Bind(gl, verifyTexture, verifyTarget);
	Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

	for (GLint sample = 0; sample < mState.samples; ++sample)
	{
		deMemset(out_data, 255, texSize);

		Texture::Bind(gl, verifyTexture, verifyTarget);
		Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, depth, GL_RED, GL_UNSIGNED_BYTE,
						  (GLvoid*)out_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

		std::string shader = st2_compute_atomicVerify;

		// Adjust shader source to texture format
		TokenStrings s		  = createShaderTokens(target, format, sample);
		std::string  dataType = (s.returnType == "ivec4" ? "int" : "uint");

		replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), shader);
		replaceToken("<FORMAT>", s.format.c_str(), shader);
		replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
		replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
		replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
		replaceToken("<DATA_TYPE>", dataType.c_str(), shader);
		replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);
		replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);

		ProgramSources sources;
		sources << ComputeSource(shader);

		// Build and run shader
		ShaderProgram program(m_context.getRenderContext(), sources);
		if (program.isOk())
		{
			gl.useProgram(program.getProgram());
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");
			gl.bindImageTexture(0, //unit
								verifyTexture,
								0,		  //level
								GL_FALSE, //layered
								0,		  //layer
								GL_WRITE_ONLY, GL_R8UI);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
			gl.bindImageTexture(1, //unit
								texture,
								level,	//level
								GL_FALSE, //layered
								0,		  //layer
								GL_READ_ONLY, format);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
			gl.uniform1i(1, 0 /* image_unit */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			gl.uniform1i(2, 1 /* image_unit */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			gl.uniform1i(3, widthCommitted /* committed width */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			gl.dispatchCompute(width, height, depth);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
			gl.memoryBarrier(GL_ALL_BARRIER_BITS);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");

			Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

			//Verify only committed region
			for (GLint x = 0; x < width; ++x)
				for (GLint y = 0; y < height; ++y)
					for (GLint z = 0; z < depth; ++z)
					{
						GLubyte* dataRegion	= exp_data + ((x + y * width) + z * width * height);
						GLubyte* outDataRegion = out_data + ((x + y * width) + z * width * height);
						if (dataRegion[0] != outDataRegion[0])
						{
							printf("%d:%d ", dataRegion[0], outDataRegion[0]);
							result = false;
						}
					}
		}
		else
		{
			mLog << "Compute shader compilation failed (atomic) for target: " << target << ", format: " << format
				 << ", sample: " << sample << ", infoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
				 << ", shaderSource: " << shader.c_str() << " - ";

			result = false;
		}
	}

	Texture::Delete(gl, verifyTexture);

	return result;
}